

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah_mb.cpp
# Opt level: O2

void __thiscall
embree::avx::BVHNBuilderMBlurSAH<8,_embree::InstanceArray,_embree::InstanceArrayPrimitive>::
buildMultiSegment(BVHNBuilderMBlurSAH<8,_embree::InstanceArray,_embree::InstanceArrayPrimitive>
                  *this,size_t numPrimitives)

{
  long lVar1;
  BVH *pBVar2;
  double dVar3;
  Scene *scene;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  mvector<PrimRefMB> local_180;
  undefined8 local_158;
  undefined8 local_150;
  long local_148;
  ulong local_140;
  ulong local_138;
  undefined4 local_130;
  float local_12c;
  undefined1 local_128;
  size_t local_120;
  undefined **local_118;
  Scene *local_110;
  PrimInfoMB pinfo;
  BVHNodeRecordMB4D<embree::NodeRefPtr<8>_> root;
  
  scene = this->scene;
  lVar4 = *(long *)&(scene->super_AccelN).field_0x188;
  local_180.alloc.device = (MemoryMonitorInterface *)(lVar4 + 0x550);
  if (lVar4 == 0) {
    local_180.alloc.device = (MemoryMonitorInterface *)0x0;
  }
  local_180.alloc.hugepages = false;
  local_180.items = (PrimRefMB *)0x0;
  local_180.size_active = 0;
  local_180.size_alloced = 0;
  if (numPrimitives != 0) {
    uVar6 = numPrimitives * 0x50;
    (**(local_180.alloc.device)->_vptr_MemoryMonitorInterface)(local_180.alloc.device,uVar6,0);
    if (uVar6 < 0x1c00000) {
      local_180.items = (PrimRefMB *)alignedMalloc(uVar6,0x10);
    }
    else {
      local_180.items = (PrimRefMB *)os_malloc(uVar6,&local_180.alloc.hugepages);
    }
    scene = this->scene;
    local_180.size_alloced = numPrimitives;
  }
  local_180.size_active = local_180.size_alloced;
  createPrimRefArrayMSMBlur
            (&pinfo,scene,this->gtype_,numPrimitives,&local_180,
             &(this->bvh->scene->progressInterface).super_BuildProgressMonitor,
             (BBox1f)0x3f80000000000000);
  if (pinfo.object_range._end == pinfo.object_range._begin) {
    (*(this->bvh->super_AccelData).super_RefCount._vptr_RefCount[5])();
  }
  else {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = pinfo.num_time_segments;
    auVar7 = vpunpckldq_avx(auVar7,_DAT_01f46b10);
    auVar7 = vsubpd_avx(auVar7,_DAT_01f46b20);
    dVar3 = (auVar7._0_8_ + auVar7._8_8_) * 1.2 * 8.0;
    uVar6 = (ulong)dVar3;
    sVar5 = ((long)(dVar3 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6) +
            (pinfo.num_time_segments * 0x1c0 >> 5);
    FastAllocator::init_estimate(&this->bvh->alloc,sVar5);
    local_158 = 8;
    local_150 = 0x50;
    local_148 = 0x3f;
    if (this->sahBlockSize != 0) {
      for (; this->sahBlockSize >> local_148 == 0; local_148 = local_148 + -1) {
      }
    }
    local_138 = this->maxLeafSize;
    local_140 = this->minLeafSize;
    if (local_138 <= this->minLeafSize) {
      local_140 = local_138;
    }
    local_130 = 0x3f800000;
    local_12c = this->intCost;
    local_128 = 0;
    local_120 = FastAllocator::fixSingleThreadThreshold
                          (&this->bvh->alloc,8,0x400,
                           pinfo.object_range._end - pinfo.object_range._begin,sVar5);
    lVar1 = *(long *)&(this->scene->super_AccelN).field_0x188;
    lVar4 = lVar1 + 0x550;
    if (lVar1 == 0) {
      lVar4 = 0;
    }
    pBVar2 = this->bvh;
    local_118 = &PTR_operator___021d4948;
    local_110 = (pBVar2->scene->progressInterface).scene;
    BVHBuilderMSMBlur::
    build<embree::NodeRefPtr<8>,embree::avx::RecalculatePrimRef<embree::InstanceArray>,embree::BVHN<8>::CreateAlloc,embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,8>::Create,embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,8>::Set,embree::avx::CreateMSMBlurLeaf<8,embree::InstanceArray,embree::InstanceArrayPrimitive>,embree::Scene::BuildProgressMonitorInterface>
              (&root,(BVHBuilderMSMBlur *)&local_180,&pinfo,lVar4,this->scene,&pBVar2->alloc,pBVar2,
               &local_118,&local_158);
    BVHN<8>::set(this->bvh,(NodeRef)root.ref.ptr,&root.lbounds,pinfo.num_time_segments);
  }
  sVar5 = local_180.size_alloced;
  if (local_180.items != (PrimRefMB *)0x0) {
    if (local_180.size_alloced * 0x50 < 0x1c00000) {
      alignedFree(local_180.items);
    }
    else {
      os_free(local_180.items,local_180.size_alloced * 0x50,local_180.alloc.hugepages);
    }
  }
  if (sVar5 != 0) {
    (**(local_180.alloc.device)->_vptr_MemoryMonitorInterface)
              (local_180.alloc.device,sVar5 * -0x50,1);
  }
  return;
}

Assistant:

void buildMultiSegment(size_t numPrimitives)
      {
        /* create primref array */
        mvector<PrimRefMB> prims(scene->device,numPrimitives);
	PrimInfoMB pinfo = createPrimRefArrayMSMBlur(scene,gtype_,numPrimitives,prims,bvh->scene->progressInterface);

        /* early out if no valid primitives */
        if (pinfo.size() == 0) { bvh->clear(); return; }

        /* estimate acceleration structure size */
        const size_t node_bytes = pinfo.num_time_segments*sizeof(AABBNodeMB)/(4*N);
        const size_t leaf_bytes = size_t(1.2*Primitive::blocks(pinfo.num_time_segments)*sizeof(Primitive));
        bvh->alloc.init_estimate(node_bytes+leaf_bytes);

        /* settings for BVH build */
        BVHBuilderMSMBlur::Settings settings;
        settings.branchingFactor = N;
        settings.maxDepth = BVH::maxDepth;
        settings.logBlockSize = bsr(sahBlockSize);
        settings.minLeafSize = min(minLeafSize,maxLeafSize);
        settings.maxLeafSize = maxLeafSize;
        settings.travCost = travCost;
        settings.intCost = intCost;
        settings.singleLeafTimeSegment = Primitive::singleTimeSegment;
        settings.singleThreadThreshold = bvh->alloc.fixSingleThreadThreshold(N,DEFAULT_SINGLE_THREAD_THRESHOLD,pinfo.size(),node_bytes+leaf_bytes);
        
        /* build hierarchy */
        auto root =
          BVHBuilderMSMBlur::build<NodeRef>(prims,pinfo,scene->device,
                                            RecalculatePrimRef<Mesh>(scene),
                                            typename BVH::CreateAlloc(bvh),
                                            typename BVH::AABBNodeMB4D::Create(),
                                            typename BVH::AABBNodeMB4D::Set(),
                                            CreateMSMBlurLeaf<N,Mesh,Primitive>(bvh),
                                            bvh->scene->progressInterface,
                                            settings);

        bvh->set(root.ref,root.lbounds,pinfo.num_time_segments);
      }